

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

int Maj3_ManExactSynthesis(int nVars,int nNodes,int fVerbose,Vec_Int_t *vLevels)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Maj3_Man_t *p;
  abctime aVar5;
  abctime aVar6;
  word *pwVar7;
  abctime time;
  abctime time_00;
  long lVar8;
  uint uVar9;
  char *__format;
  int i;
  ulong uVar10;
  bool bVar11;
  int iMint;
  uint local_dc;
  uint local_d8;
  int local_d4;
  abctime local_d0;
  int pFanins [3];
  word *local_b8 [17];
  
  local_d4 = fVerbose;
  local_d0 = Abc_Clock();
  iMint = 0;
  printf("Running exact synthesis for %d-input majority with %d MAJ3 gates...\n",(ulong)(uint)nVars,
         nNodes);
  p = Maj3_ManAlloc(nVars,nNodes,vLevels);
  uVar10 = 0;
  local_d8 = 0;
  local_dc = 0;
  do {
    if ((int)uVar10 == -1) {
LAB_004a6540:
      printf("Realization of %d-input majority using %d MAJ3 gates:\n",(ulong)(uint)p->nVars,
             (ulong)(uint)p->nNodes);
      uVar4 = p->nObjs;
      while (p->nVars < (int)uVar4) {
        uVar4 = uVar4 - 1;
        printf("%02d = MAJ(",(ulong)uVar4);
        iVar2 = Maj3_ManFindFanin(p,uVar4,(int *)local_b8);
        if (iVar2 != 3) {
          __assert_fail("nFanins == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                        ,0xcb,"void Maj3_ManPrintSolution(Maj3_Man_t *)");
        }
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          uVar9 = *(uint *)((long)local_b8 + lVar8 * 4);
          if (((int)uVar9 < 0) || (p->nVars <= (int)uVar9)) {
            __format = " %02d";
          }
          else {
            uVar9 = uVar9 + 0x61;
            __format = " %c";
          }
          printf(__format,(ulong)uVar9);
        }
        puts(" )");
      }
LAB_004a6503:
      Maj3_ManFree(p);
      aVar5 = Abc_Clock();
      Abc_PrintTime(0x79ba37,(char *)(aVar5 - local_d0),time_00);
      return (int)(iMint == -1);
    }
    aVar5 = Abc_Clock();
    iVar2 = Maj3_ManAddCnf(p,iMint);
    if (iVar2 == 0) {
LAB_004a64fc:
      if (iMint != -1) goto LAB_004a6503;
      goto LAB_004a6540;
    }
    while( true ) {
      iVar2 = bmcg_sat_solver_solve(p->pSat,(int *)0x0,0);
      if (iVar2 != 1) break;
      iVar3 = Maj3_ManAddConstraintsLazy(p);
      if (iVar3 == 0) break;
      if (iVar3 == -1) {
        puts("Became UNSAT after adding lazy constraints.");
        bVar11 = true;
        goto LAB_004a633d;
      }
      local_d8 = local_d8 + iVar3;
    }
    bVar11 = iVar2 == -1;
LAB_004a633d:
    if (local_d4 != 0) {
      printf("Iter %3d : ",(ulong)local_dc);
      Extra_PrintBinary(_stdout,(uint *)&iMint,p->nVars);
      printf("  Var =%5d  ",(ulong)(uint)p->iVar);
      uVar4 = bmcg_sat_solver_clausenum(p->pSat);
      printf("Cla =%6d  ",(ulong)uVar4);
      uVar4 = bmcg_sat_solver_conflictnum(p->pSat);
      printf("Conf =%9d  ",(ulong)uVar4);
      printf("Lazy =%9d  ",(ulong)local_d8);
      aVar6 = Abc_Clock();
      Abc_PrintTime(0x816bba,(char *)(aVar6 - aVar5),time);
    }
    if (bVar11) {
      puts("The problem has no solution.");
      goto LAB_004a64fc;
    }
    for (iVar2 = p->nVars; iVar2 < p->nObjs; iVar2 = iVar2 + 1) {
      iVar3 = Maj3_ManFindFanin(p,iVar2,pFanins);
      if (iVar3 != 3) {
        __assert_fail("nFanins == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                      ,0xdf,"int Maj3_ManEval(Maj3_Man_t *)");
      }
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        pwVar7 = Maj3_ManTruth(p,pFanins[lVar8]);
        local_b8[lVar8] = pwVar7;
      }
      pwVar7 = Maj3_ManTruth(p,iVar2);
      Abc_TtMaj(pwVar7,local_b8[0],local_b8[1],local_b8[2],p->nWords);
    }
    uVar10 = 0;
    while( true ) {
      iVar2 = p->nVars;
      iVar3 = 1 << ((byte)iVar2 & 0x1f);
      i = (int)uVar10;
      if (iVar3 <= i) break;
      iVar3 = Abc_TtBitCount16(i);
      iVar2 = iVar2 / 2;
      if (iVar3 <= iVar2 + 1 && iVar2 <= iVar3) {
        pwVar7 = Maj3_ManTruth(p,p->nObjs);
        uVar1 = pwVar7[uVar10 >> 6];
        pwVar7 = Maj3_ManTruth(p,p->nObjs + -1);
        if (((uVar1 ^ pwVar7[uVar10 >> 6]) >> (uVar10 & 0x3f) & 1) != 0) {
          iVar3 = 1 << ((byte)p->nVars & 0x1f);
          goto LAB_004a64d9;
        }
      }
      uVar10 = (ulong)(i + 1);
    }
    uVar10 = 0xffffffff;
LAB_004a64d9:
    if (iVar3 <= (int)uVar10) {
      __assert_fail("iMint < (1 << p->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                    ,0xfa,"int Maj3_ManEval(Maj3_Man_t *)");
    }
    local_dc = local_dc + 1;
    iMint = (int)uVar10;
  } while( true );
}

Assistant:

int Maj3_ManExactSynthesis( int nVars, int nNodes, int fVerbose, Vec_Int_t * vLevels )
{
    Maj3_Man_t * p;  abctime clkTotal = Abc_Clock();
    int i, status, nLazy, nLazyAll = 0, iMint = 0;
    printf( "Running exact synthesis for %d-input majority with %d MAJ3 gates...\n", nVars, nNodes );
    p = Maj3_ManAlloc( nVars, nNodes, vLevels );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Maj3_ManAddCnf( p, iMint ) )
            break;
        while ( (status = bmcg_sat_solver_solve(p->pSat, NULL, 0)) == GLUCOSE_SAT )
        {
            nLazy = Maj3_ManAddConstraintsLazy( p );
            if ( nLazy == -1 )
            {
                printf( "Became UNSAT after adding lazy constraints.\n" );
                status = GLUCOSE_UNSAT;
                break;
            }
            //printf( "Added %d lazy constraints.\n\n", nLazy );
            if ( nLazy == 0 )
                break;
            nLazyAll += nLazy;
        }
        if ( fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", bmcg_sat_solver_clausenum(p->pSat) );
            printf( "Conf =%9d  ", bmcg_sat_solver_conflictnum(p->pSat) );
            printf( "Lazy =%9d  ", nLazyAll );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == GLUCOSE_UNSAT )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        iMint = Maj3_ManEval( p );
    }
    if ( iMint == -1 )
        Maj3_ManPrintSolution( p );
    Maj3_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return iMint == -1;
}